

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::GenvarDeclarationSyntax::setChild
          (GenvarDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  undefined8 in_RDX;
  
  (*(code *)(&DAT_00509cf8 + *(int *)(&DAT_00509cf8 + index * 4)))
            (&child,index,in_RDX,&DAT_00509cf8 + *(int *)(&DAT_00509cf8 + index * 4));
  return;
}

Assistant:

void GenvarDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: keyword = child.token(); return;
        case 2: identifiers = child.node()->as<SeparatedSyntaxList<IdentifierNameSyntax>>(); return;
        case 3: semi = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}